

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.hxx
# Opt level: O0

string * __thiscall
cmsys::RegularExpression::match_abi_cxx11_
          (string *__return_storage_ptr__,RegularExpression *this,int n)

{
  char *pcVar1;
  char *pcVar2;
  allocator local_2d [16];
  allocator local_1d;
  int local_1c;
  RegularExpression *pRStack_18;
  int n_local;
  RegularExpression *this_local;
  
  local_1c = n;
  pRStack_18 = this;
  this_local = (RegularExpression *)__return_storage_ptr__;
  if (this->startp[n] == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_1d);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d);
  }
  else {
    pcVar1 = this->startp[n];
    pcVar2 = this->endp[n];
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,pcVar1,(long)pcVar2 - (long)pcVar1,local_2d);
    std::allocator<char>::~allocator((allocator<char> *)local_2d);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string RegularExpression::match(int n) const
{
  if (this->startp[n]==0)
    {
    return std::string("");
    }
  else
    {
    return std::string(this->startp[n],
                             static_cast<std::string::size_type>(
                               this->endp[n] - this->startp[n]));
    }
}